

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_gen_tables(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int local_834;
  int local_82c;
  int local_824;
  uint local_81c;
  int aiStack_818 [2];
  int log [256];
  int pow [256];
  int z;
  int y;
  int x;
  int i;
  
  z = 1;
  for (y = 0; y < 0x100; y = y + 1) {
    log[(long)y + 0xfe] = z;
    aiStack_818[z] = y;
    uVar4 = 0;
    if ((z & 0x80U) != 0) {
      uVar4 = 0x1b;
    }
    z = (z ^ z << 1 ^ uVar4) & 0xff;
  }
  z = 1;
  for (y = 0; y < 10; y = y + 1) {
    RCON[y] = z;
    uVar4 = 0;
    if ((z & 0x80U) != 0) {
      uVar4 = 0x1b;
    }
    z = (z << 1 ^ uVar4) & 0xff;
  }
  FSb[0] = 'c';
  RSb[99] = '\0';
  for (y = 1; y < 0x100; y = y + 1) {
    uVar4 = log[(long)(0xff - aiStack_818[y]) + 0xfe];
    uVar1 = uVar4 << 1 | (int)uVar4 >> 7;
    uVar2 = uVar1 & 0xff;
    uVar5 = (int)uVar2 >> 7;
    uVar1 = (uVar1 & 0x7f) << 1;
    uVar6 = (int)(uVar1 | uVar5) >> 7;
    uVar3 = (uVar1 & 0x7f | uVar5) << 1 | uVar6;
    uVar4 = (((uVar1 & 0x3f | uVar5) << 1 | uVar6) << 1 | (int)uVar3 >> 7) ^ 99 ^
            uVar3 ^ (uVar1 | uVar5) ^ uVar2 ^ uVar4;
    FSb[y] = (uchar)uVar4;
    RSb[(int)uVar4] = (uchar)y;
  }
  for (y = 0; y < 0x100; y = y + 1) {
    uVar4 = (uint)FSb[y];
    uVar1 = 0;
    if ((FSb[y] & 0x80) != 0) {
      uVar1 = 0x1b;
    }
    uVar1 = (uVar4 << 1 ^ uVar1) & 0xff;
    FT0[y] = uVar1 ^ uVar4 << 8 ^ uVar4 << 0x10 ^ (uVar1 ^ uVar4) << 0x18;
    FT1[y] = FT0[y] << 8 | FT0[y] >> 0x18;
    FT2[y] = FT1[y] << 8 | FT1[y] >> 0x18;
    FT3[y] = FT2[y] << 8 | FT2[y] >> 0x18;
    uVar4 = (uint)RSb[y];
    if (uVar4 == 0) {
      local_81c = 0;
      local_824 = 0;
    }
    else {
      local_81c = log[(long)((log[0xc] + aiStack_818[(int)uVar4]) % 0xff) + 0xfe];
      local_824 = log[(long)((log[7] + aiStack_818[(int)uVar4]) % 0xff) + 0xfe];
    }
    if (uVar4 == 0) {
      local_82c = 0;
    }
    else {
      local_82c = log[(long)((log[0xb] + aiStack_818[(int)uVar4]) % 0xff) + 0xfe];
    }
    if (uVar4 == 0) {
      local_834 = 0;
    }
    else {
      local_834 = log[(long)((log[9] + aiStack_818[(int)uVar4]) % 0xff) + 0xfe];
    }
    RT0[y] = local_81c ^ local_824 << 8 ^ local_82c << 0x10 ^ local_834 << 0x18;
    RT1[y] = RT0[y] << 8 | RT0[y] >> 0x18;
    RT2[y] = RT1[y] << 8 | RT1[y] >> 0x18;
    RT3[y] = RT2[y] << 8 | RT2[y] >> 0x18;
  }
  return;
}

Assistant:

static void aes_gen_tables( void )
{
    int i, x, y, z;
    int pow[256];
    int log[256];

    /*
     * compute pow and log tables over GF(2^8)
     */
    for( i = 0, x = 1; i < 256; i++ )
    {
        pow[i] = x;
        log[x] = i;
        x = ( x ^ XTIME( x ) ) & 0xFF;
    }

    /*
     * calculate the round constants
     */
    for( i = 0, x = 1; i < 10; i++ )
    {
        RCON[i] = (uint32_t) x;
        x = XTIME( x ) & 0xFF;
    }

    /*
     * generate the forward and reverse S-boxes
     */
    FSb[0x00] = 0x63;
    RSb[0x63] = 0x00;

    for( i = 1; i < 256; i++ )
    {
        x = pow[255 - log[i]];

        y  = x; y = ( ( y << 1 ) | ( y >> 7 ) ) & 0xFF;
        x ^= y; y = ( ( y << 1 ) | ( y >> 7 ) ) & 0xFF;
        x ^= y; y = ( ( y << 1 ) | ( y >> 7 ) ) & 0xFF;
        x ^= y; y = ( ( y << 1 ) | ( y >> 7 ) ) & 0xFF;
        x ^= y ^ 0x63;

        FSb[i] = (unsigned char) x;
        RSb[x] = (unsigned char) i;
    }

    /*
     * generate the forward and reverse tables
     */
    for( i = 0; i < 256; i++ )
    {
        x = FSb[i];
        y = XTIME( x ) & 0xFF;
        z =  ( y ^ x ) & 0xFF;

        FT0[i] = ( (uint32_t) y       ) ^
                 ( (uint32_t) x <<  8 ) ^
                 ( (uint32_t) x << 16 ) ^
                 ( (uint32_t) z << 24 );

        FT1[i] = ROTL8( FT0[i] );
        FT2[i] = ROTL8( FT1[i] );
        FT3[i] = ROTL8( FT2[i] );

        x = RSb[i];

        RT0[i] = ( (uint32_t) MUL( 0x0E, x )       ) ^
                 ( (uint32_t) MUL( 0x09, x ) <<  8 ) ^
                 ( (uint32_t) MUL( 0x0D, x ) << 16 ) ^
                 ( (uint32_t) MUL( 0x0B, x ) << 24 );

        RT1[i] = ROTL8( RT0[i] );
        RT2[i] = ROTL8( RT1[i] );
        RT3[i] = ROTL8( RT2[i] );
    }
}